

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall trun::Process_Unix::IsFinished(Process_Unix *this)

{
  ILogger *pIVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  __pid_t local_20;
  uint local_1c;
  pid_t result;
  int status;
  Process_Unix *this_local;
  
  _result = this;
  local_20 = waitpid(this->pid,(int *)&local_1c,3);
  if (local_20 != 0) {
    if (local_20 != -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Process_Unix",&local_79);
      pIVar1 = gnilk::Logger::GetLogger(&local_78);
      gnilk::Log::Debug<char_const*>(pIVar1,"Process exit");
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      if ((local_1c & 0x7f) == 0) {
        this->exitStatus = kNormal;
      }
      else {
        this->exitStatus = kAbnormal;
      }
      return true;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Process_Unix",&local_41)
    ;
    pIVar1 = gnilk::Logger::GetLogger(&local_40);
    gnilk::Log::Error<char_const*>(pIVar1,"Process error");
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return false;
}

Assistant:

bool Process_Unix::IsFinished() {
	int status;
	pid_t result = waitpid(pid, &status, WNOHANG | WUNTRACED);
	if (result == 0) {
	  // Child still alive
	} else if (result == -1) {
	  // Error 
        gnilk::Logger::GetLogger("Process_Unix")->Error("Process error");
	} else {
	    // Child exited
        gnilk::Logger::GetLogger("Process_Unix")->Debug("Process exit");
        if (WIFEXITED(status)) {
            exitStatus = ProcessExitStatus::kNormal;
        } else {
            exitStatus = ProcessExitStatus::kAbnormal;
        }
        //int exitCode = WEXITSTATUS(status);
		return true;
	}		
	return false;
}